

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O0

HelicsFilter
anon_unknown.dwarf_88686::coreAddFilter
          (HelicsCore core,
          unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *filt)

{
  bool bVar1;
  pointer pFVar2;
  __normal_iterator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_*,_std::vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>_>
  *__i;
  vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
  *in_RSI;
  long in_RDI;
  __normal_iterator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_*,_std::vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>_>
  ind;
  HelicsFilter hfilt;
  CoreObject *coreObj;
  vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
  *in_stack_ffffffffffffff88;
  const_iterator __position;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  bool bVar3;
  BaseType local_44;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *local_40;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *local_38;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *local_30;
  BaseType local_28;
  InterfaceHandle local_24;
  pointer local_20;
  long local_18;
  
  __position._M_current =
       (unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)in_RSI;
  local_18 = in_RDI;
  pFVar2 = std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::
           operator->((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                       *)0x1e5e8f);
  pFVar2->valid = -0x13d9fed9;
  local_20 = std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::get
                       ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                         *)in_RSI);
  bVar1 = std::
          vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
          ::empty((vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
                   *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  bVar3 = true;
  if (!bVar1) {
    pFVar2 = std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::
             operator->((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                         *)0x1e5eca);
    local_24 = helics::Interface::getHandle(&pFVar2->filtPtr->super_Interface);
    std::
    vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
    ::back(in_RSI);
    pFVar2 = std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::
             operator->((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                         *)0x1e5eed);
    local_28 = (BaseType)helics::Interface::getHandle(&pFVar2->filtPtr->super_Interface);
    bVar3 = helics::InterfaceHandle::operator>(&local_24,(InterfaceHandle)local_28);
  }
  if (bVar3 == false) {
    local_38 = (unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               std::
               vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
               ::begin(in_stack_ffffffffffffff88);
    local_40 = (unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               std::
               vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
               ::end(in_stack_ffffffffffffff88);
    pFVar2 = std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::
             operator->((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                         *)0x1e5f5e);
    local_44 = (BaseType)helics::Interface::getHandle(&pFVar2->filtPtr->super_Interface);
    local_30 = (unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               std::
               upper_bound<__gnu_cxx::__normal_iterator<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>*,std::vector<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>,std::allocator<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>>>>,helics::InterfaceHandle,(anonymous_namespace)::__0>
                         (local_38,local_40,&local_44);
    __i = (__normal_iterator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_*,_std::vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>_>
           *)(local_18 + 0x10);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>const*,std::vector<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>,std::allocator<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>>>>
    ::
    __normal_iterator<std::unique_ptr<helics::FilterObject,std::default_delete<helics::FilterObject>>*>
              ((__normal_iterator<const_std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_*,_std::vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>_>
                *)in_RSI,__i);
    std::
    vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
    ::insert(in_RSI,__position,(value_type *)__i);
  }
  else {
    std::
    vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
    ::push_back(in_RSI,(value_type *)in_stack_ffffffffffffff88);
  }
  return local_20;
}

Assistant:

HelicsFilter coreAddFilter(HelicsCore core, std::unique_ptr<helics::FilterObject> filt)
{
    auto* coreObj = reinterpret_cast<helics::CoreObject*>(core);
    filt->valid = filterValidationIdentifier;
    HelicsFilter hfilt = filt.get();
    if (coreObj->filters.empty() || filt->filtPtr->getHandle() > coreObj->filters.back()->filtPtr->getHandle()) {
        coreObj->filters.push_back(std::move(filt));
    } else {
        auto ind = std::upper_bound(coreObj->filters.begin(), coreObj->filters.end(), filt->filtPtr->getHandle(), filterSearch);
        coreObj->filters.insert(ind, std::move(filt));
    }
    return hfilt;
}